

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

int send_sasl_init(SASL_CLIENT_IO_INSTANCE *sasl_client_io,char *sasl_mechanism_name)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE sasl_frame_value;
  amqp_binary initial_response_value;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_VALUE sasl_init_value;
  LOGGER_LOG l_2;
  amqp_binary creds;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SASL_MECHANISM_BYTES init_bytes;
  SASL_INIT_HANDLE sasl_init;
  int result;
  char *sasl_mechanism_name_local;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_local;
  
  init_bytes.bytes._0_4_ = 0;
  l = (LOGGER_LOG)0x0;
  init_bytes._8_8_ = sasl_init_create(sasl_mechanism_name);
  if ((SASL_INIT_HANDLE)init_bytes._8_8_ == (SASL_INIT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"send_sasl_init",0x212,1,"Could not create sasl_init");
    }
    sasl_init._4_4_ = 0x213;
  }
  else {
    iVar1 = saslmechanism_get_init_bytes(sasl_client_io->sasl_mechanism,(SASL_MECHANISM_BYTES *)&l);
    if (iVar1 == 0) {
      if (((int)init_bytes.bytes == 0) ||
         (initial_response_value.length = (int)init_bytes.bytes, initial_response_value.bytes = l,
         initial_response_value._12_4_ = 0,
         iVar1 = sasl_init_set_initial_response
                           ((SASL_INIT_HANDLE)init_bytes._8_8_,initial_response_value), iVar1 == 0))
      {
        sasl_frame_value = amqpvalue_create_sasl_init((SASL_INIT_HANDLE)init_bytes._8_8_);
        if (sasl_frame_value == (AMQP_VALUE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                      ,"send_sasl_init",0x231,1,"Could not create SASL init");
          }
          sasl_init._4_4_ = 0x232;
        }
        else {
          iVar1 = sasl_frame_codec_encode_frame
                            (sasl_client_io->sasl_frame_codec,sasl_frame_value,on_bytes_encoded,
                             sasl_client_io);
          if (iVar1 == 0) {
            if ((sasl_client_io->field_0x78 & 1) != 0) {
              log_outgoing_frame(sasl_frame_value);
            }
            sasl_init._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                        ,"send_sasl_init",0x23a,1,"Could not encode SASL init value");
            }
            sasl_init._4_4_ = 0x23b;
          }
          amqpvalue_destroy(sasl_frame_value);
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                    ,"send_sasl_init",0x228,1,"Could not set initial response");
        }
        sasl_init._4_4_ = 0x229;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                  ,"send_sasl_init",0x21b,1,"Could not get SASL init bytes");
      }
      sasl_init._4_4_ = 0x21c;
    }
    sasl_init_destroy((SASL_INIT_HANDLE)init_bytes._8_8_);
  }
  return sasl_init._4_4_;
}

Assistant:

static int send_sasl_init(SASL_CLIENT_IO_INSTANCE* sasl_client_io, const char* sasl_mechanism_name)
{
    int result;

    SASL_INIT_HANDLE sasl_init;
    SASL_MECHANISM_BYTES init_bytes;

    init_bytes.length = 0;
    init_bytes.bytes = NULL;

    /* Codes_SRS_SASLCLIENTIO_01_045: [The name of the SASL mechanism used for the SASL exchange.] */
    sasl_init = sasl_init_create(sasl_mechanism_name);
    if (sasl_init == NULL)
    {
        /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
        LogError("Could not create sasl_init");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_SASLCLIENTIO_01_048: [The contents of this data are defined by the SASL security mechanism.] */
        if (saslmechanism_get_init_bytes(sasl_client_io->sasl_mechanism, &init_bytes) != 0)
        {
            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
            LogError("Could not get SASL init bytes");
            result = MU_FAILURE;
        }
        else
        {
            amqp_binary creds;
            creds.bytes = init_bytes.bytes;
            creds.length = init_bytes.length;
            if ((init_bytes.length > 0) &&
                /* Codes_SRS_SASLCLIENTIO_01_047: [A block of opaque data passed to the security mechanism.] */
                (sasl_init_set_initial_response(sasl_init, creds) != 0))
            {
                /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                LogError("Could not set initial response");
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE sasl_init_value = amqpvalue_create_sasl_init(sasl_init);
                if (sasl_init_value == NULL)
                {
                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                    LogError("Could not create SASL init");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_SASLCLIENTIO_01_070: [When a frame needs to be sent as part of the SASL handshake frame exchange, the send shall be done by calling `sasl_frame_codec_encode_frame`.]*/
                    if (sasl_frame_codec_encode_frame(sasl_client_io->sasl_frame_codec, sasl_init_value, on_bytes_encoded, sasl_client_io) != 0)
                    {
                        /* Codes_SRS_SASLCLIENTIO_01_071: [If `sasl_frame_codec_encode_frame` fails, then the `on_io_error` callback shall be triggered.]*/
                        LogError("Could not encode SASL init value");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (sasl_client_io->is_trace_on != 0)
                        {
                            log_outgoing_frame(sasl_init_value);
                        }

                        result = 0;
                    }

                    amqpvalue_destroy(sasl_init_value);
                }
            }
        }

        sasl_init_destroy(sasl_init);
    }

    return result;
}